

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlRpcUtil.cpp
# Opt level: O2

bool XmlRpc::XmlRpcUtil::nextTagIs(char *tag,string *xml,int *offset)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  char *__s1;
  
  iVar4 = *offset;
  if (iVar4 < (int)xml->_M_string_length) {
    __s1 = (xml->_M_dataplus)._M_p + iVar4;
    while( true ) {
      cVar1 = *__s1;
      if ((cVar1 == '\0') || (iVar2 = isspace((int)cVar1), iVar2 == 0)) break;
      __s1 = __s1 + 1;
      iVar4 = iVar4 + 1;
    }
    sVar3 = strlen(tag);
    if (cVar1 != '\0') {
      iVar2 = strncmp(__s1,tag,(long)(int)sVar3);
      if (iVar2 == 0) {
        *offset = (int)sVar3 + iVar4;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool 
XmlRpcUtil::nextTagIs(const char* tag, std::string const& xml, int* offset)
{
  if (*offset >= int(xml.length())) return false;
  const char* cp = xml.c_str() + *offset;
  int nc = 0;
  while (*cp && isspace(*cp)) {
    ++cp;
    ++nc;
  }

  int len = int(strlen(tag));
  if  (*cp && (strncmp(cp, tag, len) == 0)) {
    *offset += nc + len;
    return true;
  }
  return false;
}